

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_ptr_instance.hpp
# Opt level: O2

pointer_holder<std::unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>,_DigitalConsumer_python>
* boost::python::objects::
  make_ptr_instance<DigitalConsumer_python,boost::python::objects::pointer_holder<std::unique_ptr<DigitalConsumer_python,std::default_delete<DigitalConsumer_python>>,DigitalConsumer_python>>
  ::construct<std::unique_ptr<DigitalConsumer_python,std::default_delete<DigitalConsumer_python>>>
            (void *storage,PyObject *param_2,
            unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_> *x)

{
  _Head_base<0UL,_DigitalConsumer_python_*,_false> local_10;
  
  local_10._M_head_impl =
       (x->_M_t).
       super___uniq_ptr_impl<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>.
       _M_t.
       super__Tuple_impl<0UL,_DigitalConsumer_python_*,_std::default_delete<DigitalConsumer_python>_>
       .super__Head_base<0UL,_DigitalConsumer_python_*,_false>._M_head_impl;
  (x->_M_t).
  super___uniq_ptr_impl<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>._M_t.
  super__Tuple_impl<0UL,_DigitalConsumer_python_*,_std::default_delete<DigitalConsumer_python>_>.
  super__Head_base<0UL,_DigitalConsumer_python_*,_false>._M_head_impl =
       (DigitalConsumer_python *)0x0;
  pointer_holder<std::unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>,_DigitalConsumer_python>
  ::pointer_holder((pointer_holder<std::unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>,_DigitalConsumer_python>
                    *)storage,
                   (unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>
                    *)&local_10);
  if (local_10._M_head_impl != (DigitalConsumer_python *)0x0) {
    (*((local_10._M_head_impl)->super_DigitalConsumer).super_HFSubConsumer.super_HighFreqSub.
      _vptr_HighFreqSub[1])();
  }
  return (pointer_holder<std::unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>,_DigitalConsumer_python>
          *)storage;
}

Assistant:

static inline Holder* construct(void* storage, PyObject*, Arg& x)
    {
#if __cplusplus < 201103L
      return new (storage) Holder(x);
#else
      return new (storage) Holder(std::move(x));
#endif
    }